

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlifAig.c
# Opt level: O0

void Io_BlifReadPreparse(Io_BlifMan_t *p)

{
  bool bVar1;
  FILE *__stream;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *__s1;
  size_t sVar6;
  Io_BlifObj_t *pIVar7;
  Io_BlifObj_t **ppIVar8;
  int local_24;
  int fComment;
  int i;
  char *pPrev;
  char *pCur;
  Io_BlifMan_t *p_local;
  
  bVar1 = false;
  Vec_PtrPush(p->vLines,p->pBuffer);
  for (pPrev = p->pBuffer; *pPrev != '\0'; pPrev = pPrev + 1) {
    if (*pPrev == '\n') {
      *pPrev = '\0';
      bVar1 = false;
      Vec_PtrPush(p->vLines,pPrev + 1);
    }
    else if (*pPrev == '#') {
      bVar1 = true;
    }
    if (bVar1) {
      *pPrev = '\0';
    }
  }
  for (local_24 = 0; iVar2 = Vec_PtrSize(p->vLines), local_24 < iVar2; local_24 = local_24 + 1) {
    __s1 = (char *)Vec_PtrEntry(p->vLines,local_24);
    if (*__s1 != '\0') {
      _fComment = __s1 + -2;
      while ((p->pBuffer <= _fComment && (iVar2 = Io_BlifCharIsSpace(*_fComment), iVar2 != 0))) {
        _fComment = _fComment + -1;
      }
      if (*_fComment == '\\') {
        for (; *_fComment != '\0'; _fComment = _fComment + 1) {
          *_fComment = ' ';
        }
        *_fComment = ' ';
      }
      else {
        do {
          pPrev = __s1;
          __s1 = pPrev + 1;
          iVar2 = Io_BlifCharIsSpace(*pPrev);
        } while (iVar2 != 0);
        if (*pPrev == '.') {
          iVar2 = strncmp(__s1,"names",5);
          if (iVar2 == 0) {
            Vec_PtrPush(p->vNames,__s1);
          }
          else {
            iVar2 = strncmp(__s1,"latch",5);
            if (iVar2 == 0) {
              Vec_PtrPush(p->vLatches,__s1);
            }
            else {
              iVar2 = strncmp(__s1,"inputs",6);
              if (iVar2 == 0) {
                Vec_PtrPush(p->vInputs,__s1);
              }
              else {
                iVar2 = strncmp(__s1,"outputs",7);
                if (iVar2 == 0) {
                  Vec_PtrPush(p->vOutputs,__s1);
                }
                else {
                  iVar2 = strncmp(__s1,"model",5);
                  if (iVar2 == 0) {
                    p->pModel = __s1;
                  }
                  else {
                    iVar2 = strncmp(__s1,"end",3);
                    if ((iVar2 == 0) || (iVar2 = strncmp(__s1,"exdc",4), iVar2 == 0)) break;
                    sVar6 = strlen(pPrev);
                    if (pPrev[sVar6 - 1] == '\r') {
                      sVar6 = strlen(pPrev);
                      pPrev[sVar6 - 1] = '\0';
                    }
                    __stream = _stdout;
                    uVar3 = Io_BlifGetLine(p,pPrev);
                    fprintf(__stream,"Line %d: Skipping line \"%s\".\n",(ulong)uVar3,pPrev);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  iVar2 = Io_BlifEstimatePiNum(p);
  iVar4 = Vec_PtrSize(p->vLatches);
  iVar5 = Vec_PtrSize(p->vNames);
  p->nObjects = iVar2 + iVar4 + iVar5 + 0x200;
  pIVar7 = (Io_BlifObj_t *)malloc((long)p->nObjects << 5);
  p->pObjects = pIVar7;
  memset(p->pObjects,0,(long)p->nObjects << 5);
  p->nTableSize = p->nObjects / 2 + 1;
  ppIVar8 = (Io_BlifObj_t **)malloc((long)p->nTableSize << 3);
  p->pTable = ppIVar8;
  memset(p->pTable,0,(long)p->nTableSize << 3);
  return;
}

Assistant:

static void Io_BlifReadPreparse( Io_BlifMan_t * p )
{
    char * pCur, * pPrev;
    int i, fComment = 0;
    // parse the buffer into lines and remove comments
    Vec_PtrPush( p->vLines, p->pBuffer );
    for ( pCur = p->pBuffer; *pCur; pCur++ )
    {
        if ( *pCur == '\n' )
        {
            *pCur = 0;
            fComment = 0;
            Vec_PtrPush( p->vLines, pCur + 1 );
        }
        else if ( *pCur == '#' )
            fComment = 1;
        // remove comments
        if ( fComment )
            *pCur = 0;
    }

    // unfold the line extensions and sort lines by directive
    Vec_PtrForEachEntry( char *, p->vLines, pCur, i )
    {
        if ( *pCur == 0 )
            continue;
        // find previous non-space character
        for ( pPrev = pCur - 2; pPrev >= p->pBuffer; pPrev-- )
            if ( !Io_BlifCharIsSpace(*pPrev) )
                break;
        // if it is the line extender, overwrite it with spaces
        if ( *pPrev == '\\' )
        {
            for ( ; *pPrev; pPrev++ )
                *pPrev = ' ';
            *pPrev = ' ';
            continue;
        }
        // skip spaces at the beginning of the line
        while ( Io_BlifCharIsSpace(*pCur++) );
        // parse directives
        if ( *(pCur-1) != '.' )
            continue;
        if ( !strncmp(pCur, "names", 5) )
            Vec_PtrPush( p->vNames, pCur );
        else if ( !strncmp(pCur, "latch", 5) )
            Vec_PtrPush( p->vLatches, pCur );
        else if ( !strncmp(pCur, "inputs", 6) )
            Vec_PtrPush( p->vInputs, pCur );
        else if ( !strncmp(pCur, "outputs", 7) )
            Vec_PtrPush( p->vOutputs, pCur );
        else if ( !strncmp(pCur, "model", 5) ) 
            p->pModel = pCur;
        else if ( !strncmp(pCur, "end", 3) || !strncmp(pCur, "exdc", 4) )
            break;
        else
        {
            pCur--;
            if ( pCur[strlen(pCur)-1] == '\r' )
                pCur[strlen(pCur)-1] = 0;
            fprintf( stdout, "Line %d: Skipping line \"%s\".\n", Io_BlifGetLine(p, pCur), pCur );
        }
    }

    // count the number of objects
    p->nObjects = Io_BlifEstimatePiNum(p) + Vec_PtrSize(p->vLatches) + Vec_PtrSize(p->vNames) + 512;

    // allocate memory for objects
    p->pObjects = ABC_ALLOC( Io_BlifObj_t, p->nObjects );
    memset( p->pObjects, 0, p->nObjects * sizeof(Io_BlifObj_t) );

    // allocate memory for the hash table
    p->nTableSize = p->nObjects/2 + 1;
    p->pTable = ABC_ALLOC( Io_BlifObj_t *, p->nTableSize );
    memset( p->pTable, 0, p->nTableSize * sizeof(Io_BlifObj_t *) );
}